

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

ON_Xform * operator*(ON_Xform *__return_storage_ptr__,ON_Xform *xform,double c)

{
  ON_Xform *xc;
  double x;
  double *p1;
  double *p;
  double c_local;
  ON_Xform *xform_local;
  
  memcpy(__return_storage_ptr__,xform,0x80);
  p1 = (double *)__return_storage_ptr__;
  while (p1 < __return_storage_ptr__ + 1) {
    *p1 = *p1 * c;
    p1 = p1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform operator*(const ON_Xform& xform, double c)
{
  ON_Xform xc(xform);
  double* p = &xc.m_xform[0][0];
  double* p1 = p + 16;
  while (p < p1)
  {
    const double x = *p;
    *p++ = x*c;
  }
  return xc;
}